

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::Inserter::
insertOne(Inserter *this,qsizetype pos,X509CertificateExtension *t)

{
  undefined8 *puVar1;
  X509CertificateExtension *pXVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  X509CertificateExtension *pXVar6;
  undefined8 uVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  
  pXVar2 = this->begin;
  lVar11 = this->size;
  pXVar6 = pXVar2 + lVar11;
  this->end = pXVar6;
  this->last = pXVar2 + lVar11 + -1;
  this->where = pXVar2 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct == 0) {
    pDVar3 = pXVar6[-1].oid.d.d;
    pcVar4 = pXVar6[-1].oid.d.ptr;
    pXVar6[-1].oid.d.d = (Data *)0x0;
    pXVar6[-1].oid.d.ptr = (char16_t *)0x0;
    (pXVar6->oid).d.d = pDVar3;
    (pXVar6->oid).d.ptr = pcVar4;
    qVar5 = pXVar6[-1].oid.d.size;
    pXVar6[-1].oid.d.size = 0;
    (pXVar6->oid).d.size = qVar5;
    pDVar3 = pXVar6[-1].name.d.d;
    pcVar4 = pXVar6[-1].name.d.ptr;
    pXVar6[-1].name.d.d = (Data *)0x0;
    pXVar6[-1].name.d.ptr = (char16_t *)0x0;
    (pXVar6->name).d.d = pDVar3;
    (pXVar6->name).d.ptr = pcVar4;
    qVar5 = pXVar6[-1].name.d.size;
    pXVar6[-1].name.d.size = 0;
    (pXVar6->name).d.size = qVar5;
    uVar7 = *(undefined8 *)((long)&pXVar6[-1].value.d.data + 8);
    (pXVar6->value).d.data.shared = pXVar6[-1].value.d.data.shared;
    *(undefined8 *)((long)&(pXVar6->value).d.data + 8) = uVar7;
    uVar7 = *(undefined8 *)&pXVar6[-1].value.d.field_0x18;
    *(undefined8 *)((long)&(pXVar6->value).d.data + 0x10) =
         *(undefined8 *)((long)&pXVar6[-1].value.d.data + 0x10);
    *(undefined8 *)&(pXVar6->value).d.field_0x18 = uVar7;
    pXVar6[-1].value.d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&pXVar6[-1].value.d.data + 8) = 0;
    *(undefined8 *)((long)&pXVar6[-1].value.d.data + 0x10) = 0;
    *(undefined8 *)&pXVar6[-1].value.d.field_0x18 = 2;
    bVar10 = pXVar6[-1].supported;
    pXVar6->critical = pXVar6[-1].critical;
    pXVar6->supported = bVar10;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pXVar6 = this->last;
        puVar1 = (undefined8 *)((long)&(pXVar6->oid).d.d + lVar11);
        uVar7 = *puVar1;
        uVar9 = puVar1[1];
        *puVar1 = puVar1[-0xb];
        puVar1[1] = puVar1[-10];
        puVar1[-0xb] = uVar7;
        puVar1[-10] = uVar9;
        uVar7 = puVar1[2];
        puVar1[2] = puVar1[-9];
        puVar1[-9] = uVar7;
        uVar7 = puVar1[3];
        uVar9 = puVar1[4];
        puVar1[3] = puVar1[-8];
        puVar1[4] = puVar1[-7];
        puVar1[-8] = uVar7;
        puVar1[-7] = uVar9;
        uVar7 = puVar1[5];
        puVar1[5] = puVar1[-6];
        puVar1[-6] = uVar7;
        QVariant::operator=((QVariant *)(puVar1 + 6),(QVariant *)((long)pXVar6 + lVar11 + -0x28));
        *(undefined2 *)(&pXVar6->critical + lVar11) = *(undefined2 *)((long)pXVar6 + lVar11 + -8);
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x58;
      } while (lVar12 != this->move);
    }
    pXVar6 = this->where;
    pDVar3 = (pXVar6->oid).d.d;
    (pXVar6->oid).d.d = (t->oid).d.d;
    (t->oid).d.d = pDVar3;
    pcVar4 = (pXVar6->oid).d.ptr;
    (pXVar6->oid).d.ptr = (t->oid).d.ptr;
    (t->oid).d.ptr = pcVar4;
    qVar5 = (pXVar6->oid).d.size;
    (pXVar6->oid).d.size = (t->oid).d.size;
    (t->oid).d.size = qVar5;
    pDVar3 = (pXVar6->name).d.d;
    (pXVar6->name).d.d = (t->name).d.d;
    (t->name).d.d = pDVar3;
    pcVar4 = (pXVar6->name).d.ptr;
    (pXVar6->name).d.ptr = (t->name).d.ptr;
    (t->name).d.ptr = pcVar4;
    qVar5 = (pXVar6->name).d.size;
    (pXVar6->name).d.size = (t->name).d.size;
    (t->name).d.size = qVar5;
    QVariant::operator=(&pXVar6->value,&t->value);
    bVar10 = t->supported;
    pXVar6->critical = t->critical;
    pXVar6->supported = bVar10;
  }
  else {
    pDVar3 = (t->oid).d.d;
    (t->oid).d.d = (Data *)0x0;
    (pXVar6->oid).d.d = pDVar3;
    pcVar4 = (t->oid).d.ptr;
    (t->oid).d.ptr = (char16_t *)0x0;
    (pXVar6->oid).d.ptr = pcVar4;
    qVar5 = (t->oid).d.size;
    (t->oid).d.size = 0;
    (pXVar6->oid).d.size = qVar5;
    pDVar3 = (t->name).d.d;
    (t->name).d.d = (Data *)0x0;
    (pXVar6->name).d.d = pDVar3;
    pcVar4 = (t->name).d.ptr;
    (t->name).d.ptr = (char16_t *)0x0;
    (pXVar6->name).d.ptr = pcVar4;
    qVar5 = (t->name).d.size;
    (t->name).d.size = 0;
    (pXVar6->name).d.size = qVar5;
    pPVar8 = (t->value).d.data.shared;
    uVar7 = *(undefined8 *)((long)&(t->value).d.data + 8);
    uVar9 = *(undefined8 *)&(t->value).d.field_0x18;
    *(undefined8 *)((long)&(pXVar6->value).d.data + 0x10) =
         *(undefined8 *)((long)&(t->value).d.data + 0x10);
    *(undefined8 *)&(pXVar6->value).d.field_0x18 = uVar9;
    (pXVar6->value).d.data.shared = pPVar8;
    *(undefined8 *)((long)&(pXVar6->value).d.data + 8) = uVar7;
    *(undefined8 *)((long)&(t->value).d.data + 0x10) = 0;
    (t->value).d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(t->value).d.data + 8) = 0;
    *(undefined8 *)&(t->value).d.field_0x18 = 2;
    bVar10 = t->supported;
    pXVar6->critical = t->critical;
    pXVar6->supported = bVar10;
    this->size = this->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }